

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O2

string * GetSafeProperty_abi_cxx11_
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,char *key)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,key,&local_39);
  pcVar1 = cmGeneratorTarget::GetProperty(target,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pcVar2 = "";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetSafeProperty(cmGeneratorTarget const* target,
                                   const char* key)
{
  const char* tmp = target->GetProperty(key);
  return std::string((tmp != CM_NULLPTR) ? tmp : "");
}